

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O1

void ncnn::convolution_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  int k;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  uint _w;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  void *pvVar18;
  undefined4 *puVar19;
  long lVar20;
  ulong local_c8;
  void *local_b0;
  void *local_a8;
  Mat local_98;
  long local_48;
  void *local_40;
  long local_38;
  
  _w = kernel_w * kernel_h;
  local_c8 = 0;
  Mat::reshape(&local_98,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar3 = outch + 7;
  if (-1 < outch) {
    iVar3 = outch;
  }
  iVar4 = outch % 8 + 3;
  if (-1 < outch % 8) {
    iVar4 = outch % 8;
  }
  Mat::create(kernel_tm,_w * 8,inch,outch % 4 + (iVar3 >> 3) + (iVar4 >> 2),4,(Allocator *)0x0);
  uVar7 = (ulong)(uint)inch;
  uVar8 = (ulong)_w;
  if (7 < outch) {
    pvVar6 = kernel_tm->data;
    sVar1 = kernel_tm->cstep;
    sVar2 = kernel_tm->elemsize;
    lVar10 = local_98.elemsize * local_98.cstep;
    pvVar9 = local_98.data;
    uVar11 = 0;
    do {
      if (0 < inch) {
        puVar19 = (undefined4 *)((uVar11 >> 3) * sVar1 * sVar2 + (long)pvVar6);
        uVar16 = 0;
        pvVar14 = pvVar9;
        do {
          if (0 < (int)_w) {
            uVar5 = 0;
            do {
              *puVar19 = *(undefined4 *)((long)pvVar14 + uVar5 * 4);
              lVar20 = lVar10 + uVar5 * 4;
              puVar19[1] = *(undefined4 *)((long)pvVar14 + lVar10 + uVar5 * 4);
              lVar13 = lVar10 + lVar20;
              puVar19[2] = *(undefined4 *)((long)pvVar14 + lVar10 + lVar20);
              lVar20 = lVar10 + lVar13;
              puVar19[3] = *(undefined4 *)((long)pvVar14 + lVar10 + lVar13);
              lVar13 = lVar10 + lVar20;
              puVar19[4] = *(undefined4 *)((long)pvVar14 + lVar10 + lVar20);
              lVar20 = lVar10 + lVar13;
              puVar19[5] = *(undefined4 *)((long)pvVar14 + lVar10 + lVar13);
              puVar19[6] = *(undefined4 *)((long)pvVar14 + lVar10 + lVar20);
              puVar19[7] = *(undefined4 *)((long)pvVar14 + lVar10 * 2 + lVar20);
              puVar19 = puVar19 + 8;
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
          uVar16 = uVar16 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)local_98.w * local_98.elemsize);
        } while (uVar16 != uVar7);
      }
      local_c8 = uVar11 + 8;
      uVar16 = uVar11 + 0xf;
      pvVar9 = (void *)((long)pvVar9 + lVar10 * 8);
      uVar11 = local_c8;
    } while (uVar16 < (uint)outch);
  }
  if ((int)((uint)local_c8 | 3) < outch) {
    local_40 = kernel_tm->data;
    local_48 = kernel_tm->cstep * kernel_tm->elemsize;
    lVar10 = (long)local_98.w * local_98.elemsize;
    local_c8 = local_c8 & 0xffffffff;
    lVar20 = local_98.elemsize * local_98.cstep;
    local_a8 = (void *)((local_c8 + 3) * lVar20 + (long)local_98.data);
    local_38 = lVar20 * 4;
    local_b0 = (void *)((local_c8 + 2) * lVar20 + (long)local_98.data);
    pvVar6 = (void *)((local_c8 + 1) * lVar20 + (long)local_98.data);
    pvVar9 = (void *)(lVar20 * local_c8 + (long)local_98.data);
    do {
      if (0 < inch) {
        pvVar15 = (void *)((ulong)(((uint)(local_c8 >> 3) & 0x1fffffff) +
                                  (uint)(((uint)local_c8 >> 2 & 1) != 0)) * local_48 +
                          (long)local_40);
        uVar11 = 0;
        pvVar14 = pvVar9;
        pvVar12 = local_a8;
        pvVar17 = local_b0;
        pvVar18 = pvVar6;
        do {
          if (0 < (int)_w) {
            lVar13 = 0;
            lVar20 = 0;
            do {
              *(undefined4 *)((long)pvVar15 + lVar20 * 4) = *(undefined4 *)((long)pvVar14 + lVar20);
              *(undefined4 *)((long)pvVar15 + lVar20 * 4 + 4) =
                   *(undefined4 *)((long)pvVar18 + lVar20);
              *(undefined4 *)((long)pvVar15 + lVar20 * 4 + 8) =
                   *(undefined4 *)((long)pvVar17 + lVar20);
              *(undefined4 *)((long)pvVar15 + lVar20 * 4 + 0xc) =
                   *(undefined4 *)((long)pvVar12 + lVar20);
              lVar20 = lVar20 + 4;
              lVar13 = lVar13 + -0x10;
            } while (uVar8 * 4 - lVar20 != 0);
            pvVar15 = (void *)((long)pvVar15 - lVar13);
          }
          uVar11 = uVar11 + 1;
          pvVar12 = (void *)((long)pvVar12 + lVar10);
          pvVar17 = (void *)((long)pvVar17 + lVar10);
          pvVar18 = (void *)((long)pvVar18 + lVar10);
          pvVar14 = (void *)((long)pvVar14 + lVar10);
        } while (uVar11 != uVar7);
      }
      local_c8 = local_c8 + 4;
      local_a8 = (void *)((long)local_a8 + local_38);
      local_b0 = (void *)((long)local_b0 + local_38);
      pvVar6 = (void *)((long)pvVar6 + local_38);
      pvVar9 = (void *)((long)pvVar9 + local_38);
    } while ((int)((uint)local_c8 | 3) < outch);
  }
  if ((int)local_c8 < outch) {
    pvVar6 = kernel_tm->data;
    sVar1 = kernel_tm->cstep;
    sVar2 = kernel_tm->elemsize;
    local_c8 = local_c8 & 0xffffffff;
    pvVar9 = (void *)(local_98.cstep * local_98.elemsize * local_c8 + (long)local_98.data);
    do {
      if (0 < inch) {
        pvVar12 = (void *)((ulong)(((uint)(local_c8 >> 3) & 0x1fffffff) + ((uint)local_c8 & 3) +
                                  (uint)(((uint)local_c8 >> 2 & 1) != 0)) * sVar1 * sVar2 +
                          (long)pvVar6);
        uVar11 = 0;
        pvVar14 = pvVar9;
        do {
          if (0 < (int)_w) {
            lVar10 = 0;
            do {
              *(undefined4 *)((long)pvVar12 + lVar10) = *(undefined4 *)((long)pvVar14 + lVar10);
              lVar10 = lVar10 + 4;
            } while (uVar8 << 2 != lVar10);
            pvVar12 = (void *)((long)pvVar12 + lVar10);
          }
          uVar11 = uVar11 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)local_98.w * local_98.elemsize);
        } while (uVar11 != uVar7);
      }
      local_c8 = local_c8 + 1;
      pvVar9 = (void *)((long)pvVar9 + local_98.cstep * local_98.elemsize);
    } while (local_c8 != (uint)outch);
  }
  if (local_98.refcount != (int *)0x0) {
    LOCK();
    *local_98.refcount = *local_98.refcount + -1;
    UNLOCK();
    if (*local_98.refcount == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-maxk-inch-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
#if __SSE2__
    kernel_tm.create(8 * maxk, inch, outch / 8 + (outch % 8) / 4 + outch % 4);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);
        const Mat k4 = kernel.channel(q + 4);
        const Mat k5 = kernel.channel(q + 5);
        const Mat k6 = kernel.channel(q + 6);
        const Mat k7 = kernel.channel(q + 7);

        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);
            const float* k40 = k4.row(p);
            const float* k50 = k5.row(p);
            const float* k60 = k6.row(p);
            const float* k70 = k7.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00 += 8;
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00 += 4;
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + q % 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];

                g00 += 1;
            }
        }
    }
#else
    kernel_tm = kernel;
#endif // __SSE2__
}